

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O2

AssertionResult *
iutest::internal::CmpHelperFloatingPointComplexEQ<float>
          (AssertionResult *__return_storage_ptr__,char *expr1,char *expr2,complex<float> *val1,
          complex<float> *val2)

{
  bool bVar1;
  complex<float> *extraout_RDX;
  complex<float> *extraout_RDX_00;
  complex<float> *v;
  complex<float> *v_00;
  floating_point<float> imag2;
  floating_point<float> imag1;
  floating_point<float> real2;
  floating_point<float> real1;
  FInt local_c0;
  FInt local_bc;
  FInt local_b8;
  FInt local_b4;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_b4 = *(FInt *)&val1->_M_value;
  local_b8 = *(FInt *)&val2->_M_value;
  local_bc = *(FInt *)((long)&val1->_M_value + 4);
  local_c0 = *(FInt *)((long)&val2->_M_value + 4);
  bVar1 = floating_point<float>::AlmostEquals((floating_point<float> *)&local_b4,(_Myt *)&local_b8);
  v = extraout_RDX;
  if ((bVar1) &&
     (bVar1 = floating_point<float>::AlmostEquals
                        ((floating_point<float> *)&local_bc,(_Myt *)&local_c0), v = extraout_RDX_00,
     bVar1)) {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_string_length = 0;
    (__return_storage_ptr__->m_message).field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->m_result = true;
    return __return_storage_ptr__;
  }
  PrintToString<std::complex<float>>(&local_50,(iutest *)val1,v);
  detail::ShowStringQuoted(&local_70,&local_50);
  PrintToString<std::complex<float>>(&local_b0,(iutest *)val2,v_00);
  detail::ShowStringQuoted(&local_90,&local_b0);
  EqFailure(__return_storage_ptr__,expr1,expr2,&local_70,&local_90,false);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

inline AssertionResult CmpHelperFloatingPointComplexEQ(const char* expr1, const char* expr2
                                                , const ::std::complex<RawType>& val1, const ::std::complex<RawType>& val2)
{
    floating_point<RawType> real1(val1.real()), real2(val2.real());
    floating_point<RawType> imag1(val1.imag()), imag2(val2.imag());
    if IUTEST_COND_LIKELY( real1.AlmostEquals(real2) && imag1.AlmostEquals(imag2) )
    {
        return AssertionSuccess();
    }